

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_dalloc_bin_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  extent_t *in_RCX;
  arena_t *in_RDX;
  tsdn_t *in_RSI;
  tsdn_t *in_RDI;
  
  malloc_mutex_unlock(in_RSI,(malloc_mutex_t *)in_RDX);
  arena_slab_dalloc(in_RSI,in_RDX,in_RCX);
  malloc_mutex_lock(in_RDI,(malloc_mutex_t *)in_RSI);
  in_RCX[1].field_5.e_slab_data.bitmap[1] = in_RCX[1].field_5.e_slab_data.bitmap[1] - 1;
  return;
}

Assistant:

static void
arena_dalloc_bin_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(slab != bin->slabcur);

	malloc_mutex_unlock(tsdn, &bin->lock);
	/******************************/
	arena_slab_dalloc(tsdn, arena, slab);
	/****************************/
	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		bin->stats.curslabs--;
	}
}